

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O2

void __thiscall
amrex::GpuBndryFuncFab<PeleLMdummyFill>::ccfcdoit<amrex::FilfcFace>
          (GpuBndryFuncFab<PeleLMdummyFill> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp,FilfcFace *fillfunc)

{
  Box *pBVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Real RVar10;
  undefined8 uVar11;
  BCRec *pBVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  int idim;
  uint uVar18;
  IndexType IVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  undefined8 uVar36;
  GeometryData *pGVar37;
  Real *pRVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  ulong uVar46;
  byte bVar47;
  IntVect IVar48;
  IntVect IVar49;
  Box gdomain;
  int local_4c0;
  int local_480;
  Box bx_2;
  Dim3 local_440;
  uint local_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  int local_424 [4];
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int aiStack_408 [2];
  IndexType IStack_400;
  uint local_3fc;
  undefined8 local_3f8;
  int local_3f0;
  int iStack_3ec;
  undefined8 local_3e8;
  uint local_3e0;
  Real local_3dc;
  int local_3d4;
  Real local_3d0;
  int local_3c8;
  uint local_3c4;
  Real local_3c0;
  int local_3b8;
  int local_3b4 [6];
  int local_39c;
  Real local_398;
  int local_390;
  uint local_38c;
  Real local_370;
  int local_368;
  pointer local_360;
  long local_358;
  Box *local_350;
  Box bx_1;
  Box bx_8;
  int iStack_2cc;
  Dim3 local_2c0;
  undefined8 local_2b4;
  int local_2ac;
  int local_2a8;
  int local_2a4 [4];
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int aiStack_288 [4];
  pointer local_278;
  int local_270;
  int local_26c;
  undefined1 auStack_268 [4];
  int local_264;
  uint local_260;
  Real local_25c;
  int local_254;
  Real local_250;
  int local_248;
  uint local_244;
  Real local_240;
  int local_238;
  int local_234 [6];
  int local_21c;
  Real local_218;
  int local_210;
  uint local_20c;
  Real local_208;
  int local_200;
  ulong local_1fc;
  int local_1f4;
  undefined8 local_1f0;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  int local_1d8;
  uint local_1d4;
  undefined8 local_1d0;
  int local_1c8;
  undefined8 local_1c4;
  int local_1bc;
  uint local_1b8;
  undefined8 local_1b4;
  int local_1ac;
  undefined8 local_1a8;
  int local_1a0;
  uint local_19c;
  Box tmp;
  int local_170 [3];
  Box local_160;
  Box local_140;
  Box local_120;
  Box local_100;
  Box local_e0;
  Box local_c4;
  GeometryData geomdata;
  
  bVar47 = 0;
  IVar48 = Box::length(bx);
  iVar28 = IVar48.vect[2];
  local_170[0] = IVar48.vect[0];
  local_170[1] = IVar48.vect[1];
  local_170[2] = IVar48.vect[2];
  local_350 = bx;
  uVar3 = (bx->btype).itype;
  uVar7 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar36 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  bx_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  bx_1._20_8_ = *(undefined8 *)((geom->domain).bigend.vect + 2);
  bx_1.smallend.vect[0] = (int)uVar7;
  bx_1.smallend.vect[1] = SUB84(uVar7,4);
  bx_1.smallend.vect[2] = (int)uVar36;
  bx_1.bigend.vect[0] = (int)((ulong)uVar36 >> 0x20);
  for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
    uVar18 = 1 << ((byte)lVar26 & 0x1f);
    uVar39 = (uint)lVar26;
    bx_1.bigend.vect[lVar26] =
         (bx_1.bigend.vect[lVar26] + (uint)((uVar3 >> (uVar39 & 0x1f) & 1) != 0)) -
         (uint)((bx_1.btype.itype >> (uVar39 & 0x1f) & 1) != 0);
    if ((uVar3 >> (uVar39 & 0x1f) & 1) == 0) {
      IVar19.itype = ~uVar18 & bx_1.btype.itype;
    }
    else {
      IVar19.itype = uVar18 | bx_1.btype.itype;
    }
    bx_1.btype.itype = IVar19.itype;
  }
  gdomain.bigend.vect[1] = bx_1.bigend.vect[1];
  gdomain.bigend.vect[2] = bx_1.bigend.vect[2];
  gdomain.smallend.vect[0] = (int)uVar7;
  gdomain.smallend.vect[1] = SUB84(uVar7,4);
  gdomain.smallend.vect[2] = bx_1.smallend.vect[2];
  gdomain.bigend.vect[0] = bx_1.bigend.vect[0];
  for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar26 + 0x19) == '\x01') {
      iVar4 = local_170[lVar26];
      piVar2 = gdomain.smallend.vect + lVar26;
      *piVar2 = *piVar2 - iVar4;
      piVar2 = gdomain.bigend.vect + lVar26;
      *piVar2 = *piVar2 + iVar4;
    }
  }
  gdomain.btype.itype = bx_1.btype.itype;
  local_170 = IVar48.vect;
  bVar17 = Box::contains(&gdomain,bx);
  if (!bVar17) {
    pdVar6 = (dest->super_BaseFab<double>).dptr;
    iVar4 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar22 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    iVar13 = (pBVar1->smallend).vect[0];
    iVar14 = (pBVar1->smallend).vect[1];
    iVar5 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar26 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    uVar46 = lVar26 + 1;
    lVar31 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar20 = (dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_358 = (lVar26 - (pBVar1->smallend).vect[0]) + 1;
    Geometry::data(geom);
    IStack_400.itype = gdomain.bigend.vect[2];
    aiStack_408[1] = gdomain.bigend.vect[1];
    iVar21 = gdomain.bigend.vect[0];
    iStack_40c = gdomain.smallend.vect[2];
    iStack_410 = gdomain.smallend.vect[1];
    local_360 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_4c0 = IVar48.vect[0];
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffffe;
    bx_2.smallend.vect[0] = gdomain.smallend.vect[0] - local_4c0;
    bx_2.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_2.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_2.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_2.bigend.vect[2] = gdomain.bigend.vect[2];
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      bx_2.bigend.vect[lVar26] =
           (bx_2.bigend.vect[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((bx_2.btype.itype >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        bx_2.btype.itype = ~uVar39 & bx_2.btype.itype;
      }
      else {
        bx_2.btype.itype = uVar39 | bx_2.btype.itype;
      }
    }
    uVar42 = lVar31 << 0x20 | uVar46 & 0xffffffff;
    uVar32 = (lVar31 - iVar22) * local_358;
    local_480 = IVar48.vect[1];
    local_434 = gdomain.btype.itype & 0xfffffffd;
    local_440.y = gdomain.smallend.vect[1] + -1;
    local_440.x = gdomain.bigend.vect[0];
    local_440.z = gdomain.bigend.vect[2];
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&local_440.x)[lVar26] =
           ((&local_440.x)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_434 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_434 = ~uVar39 & local_434;
      }
      else {
        local_434 = uVar39 | local_434;
      }
    }
    local_424[3] = gdomain.btype.itype & 0xfffffffb;
    iStack_430 = gdomain.smallend.vect[0];
    iStack_42c = gdomain.smallend.vect[1];
    local_428 = gdomain.smallend.vect[2] - iVar28;
    local_424[0] = gdomain.bigend.vect[0];
    local_424[1] = gdomain.bigend.vect[1];
    local_424[2] = gdomain.smallend.vect[2] + -1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      local_424[lVar26] =
           (local_424[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_424[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_424[3] = ~uVar39 & local_424[3];
      }
      else {
        local_424[3] = uVar39 | local_424[3];
      }
    }
    IVar49 = Box::type(&gdomain);
    local_3e8._4_4_ = gdomain.bigend.vect[2];
    iVar24 = gdomain.bigend.vect[1];
    iStack_3ec = gdomain.bigend.vect[0];
    local_3f0 = gdomain.smallend.vect[2];
    iVar22 = gdomain.smallend.vect[0];
    iStack_414 = (iVar21 - (IVar49.vect[0] & 1)) + 1;
    iVar21 = local_4c0 + -1;
    local_3fc = gdomain.btype.itype & 0xfffffffe;
    aiStack_408[0] = iVar21 + iStack_414;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      aiStack_408[lVar26] =
           (aiStack_408[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3fc >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3fc = ~uVar39 & local_3fc;
      }
      else {
        local_3fc = uVar39 | local_3fc;
      }
    }
    iVar43 = local_480 + -1;
    IVar49 = Box::type(&gdomain);
    iVar45 = gdomain.bigend.vect[2];
    iVar24 = iVar24 + (int)((IVar49.vect._0_8_ << 0x1f) >> 0x3f) + 1;
    local_3e0 = gdomain.btype.itype & 0xfffffffd;
    local_3f8 = (pointer)CONCAT44(iVar24,iVar22);
    local_3e8._0_4_ = iVar24 + iVar43;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&iStack_3ec)[lVar26] =
           ((&iStack_3ec)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3e0 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3e0 = ~uVar39 & local_3e0;
      }
      else {
        local_3e0 = uVar39 | local_3e0;
      }
    }
    uVar7._4_4_ = gdomain.smallend.vect[1];
    uVar7._0_4_ = gdomain.smallend.vect[0];
    RVar10 = (Real)CONCAT44(gdomain.bigend.vect[1],gdomain.bigend.vect[0]);
    IVar49 = Box::type(&gdomain);
    local_3d4 = (iVar45 - (IVar49.vect[2] & 1)) + 1;
    iVar22 = iVar28 + -1;
    local_3c4 = gdomain.btype.itype & 0xfffffffb;
    local_3dc = (Real)uVar7;
    local_3d0 = RVar10;
    local_3c8 = iVar22 + local_3d4;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_3d0 + lVar26 * 4) =
           (*(int *)((long)&local_3d0 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar39 & local_3c4;
      }
      else {
        local_3c4 = uVar39 | local_3c4;
      }
    }
    local_360 = local_360 + bcomp;
    for (lVar26 = 0; iVar30 = bx_8.bigend.vect[0], iVar33 = bx_8.smallend.vect[2],
        iVar45 = gdomain.bigend.vect[2], iVar24 = gdomain.bigend.vect[0],
        bx_8.smallend.vect[2] = (int)pdVar6, iVar15 = bx_8.smallend.vect[2],
        bx_8.bigend.vect[0] = (int)((ulong)pdVar6 >> 0x20), iVar16 = bx_8.bigend.vect[0],
        lVar26 != 0xa8; lVar26 = lVar26 + 0x1c) {
      uVar7 = *(undefined8 *)((long)bx_2.smallend.vect + lVar26);
      uVar36 = *(undefined8 *)((long)bx_2.smallend.vect + lVar26 + 8);
      uVar8 = *(undefined8 *)((long)bx_2.bigend.vect + lVar26 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_2.bigend.vect + lVar26) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar8;
      tmp.btype.itype = (uint)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar7;
      tmp.smallend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar36;
      tmp.bigend.vect[0] = (int)((ulong)uVar36 >> 0x20);
      bx_8.smallend.vect[2] = iVar33;
      bx_8.bigend.vect[0] = iVar30;
      Box::operator&=(&tmp,local_350);
      bx_8.bigend.vect[1] = (int)local_358;
      bx_8.bigend.vect[2] = (int)((ulong)local_358 >> 0x20);
      stack0xfffffffffffffd30 = uVar32;
      local_2c0.x = iVar13;
      local_2c0.y = iVar14;
      local_2c0.z = iVar5;
      local_2b4 = uVar42;
      local_2ac = iVar20;
      local_2a8 = iVar4;
      local_2a4[1] = dcomp;
      local_2a4[2] = numcomp;
      aiStack_288[0] = bx_1.bigend.vect[1];
      aiStack_288[1] = bx_1.bigend.vect[2];
      aiStack_288[2] = bx_1.btype.itype;
      local_2a4[3] = bx_1.smallend.vect[0];
      iStack_294 = bx_1.smallend.vect[1];
      iStack_290 = bx_1.smallend.vect[2];
      iStack_28c = bx_1.bigend.vect[0];
      local_278 = local_360;
      pGVar37 = &geomdata;
      pRVar38 = (Real *)auStack_268;
      for (lVar27 = 0xf; lVar27 != 0; lVar27 = lVar27 + -1) {
        *pRVar38 = (pGVar37->prob_domain).xlo[0];
        pGVar37 = (GeometryData *)((long)pGVar37 + (ulong)bVar47 * -0x10 + 8);
        pRVar38 = pRVar38 + (ulong)bVar47 * -2 + 1;
      }
      local_1e8 = orig_comp;
      bx_8.smallend.vect[2] = iVar15;
      bx_8.bigend.vect[0] = iVar16;
      local_1f0 = time;
      For<amrex::GpuBndryFuncFab<PeleLMdummyFill>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_1_>
                (&tmp,(anon_class_264_10_7336990c *)&bx_8);
    }
    iVar33 = gdomain.smallend.vect[1] + -1;
    bx_8.smallend.vect[0] = gdomain.smallend.vect[0] - local_4c0;
    bx_8.smallend.vect[1] = gdomain.smallend.vect[1] - local_480;
    bx_8.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_8.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_8.bigend.vect[1] = iVar33;
    bx_8.bigend.vect[2] = gdomain.bigend.vect[2];
    bx_8.btype.itype = gdomain.btype.itype & 0xfffffffc;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      bx_8.bigend.vect[lVar26] =
           (bx_8.bigend.vect[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((bx_8.btype.itype >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        bx_8.btype.itype = ~uVar39 & bx_8.btype.itype;
      }
      else {
        bx_8.btype.itype = uVar39 | bx_8.btype.itype;
      }
    }
    IVar49 = Box::type(&gdomain);
    iVar29 = gdomain.bigend.vect[2];
    iVar23 = gdomain.bigend.vect[1];
    iVar30 = gdomain.smallend.vect[2];
    uVar18 = IVar49.vect[0] & 1;
    stack0xfffffffffffffd30 = CONCAT44((iVar24 - uVar18) + 1,bx_8.btype.itype);
    local_2c0.y = iVar33;
    local_2c0.x = (iVar24 - uVar18) + iVar21 + 1;
    local_2c0.z = iVar45;
    local_2b4._0_4_ = gdomain.btype.itype & 0xfffffffc;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&local_2c0.x)[lVar26] =
           ((&local_2c0.x)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_2b4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_2b4._0_4_ = ~uVar39 & (uint)local_2b4;
      }
      else {
        local_2b4._0_4_ = uVar39 | (uint)local_2b4;
      }
    }
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffffe;
    iVar40 = gdomain.smallend.vect[0] - local_4c0;
    iVar34 = gdomain.smallend.vect[0] + -1;
    bx_2.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_2.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_2.bigend.vect[2] = gdomain.bigend.vect[2];
    bx_2.smallend.vect[0] = iVar40;
    bx_2.bigend.vect[0] = iVar34;
    IVar49 = Box::type(&bx_2);
    iVar25 = gdomain.bigend.vect[2];
    iVar41 = gdomain.bigend.vect[1];
    iVar44 = gdomain.bigend.vect[0];
    iVar33 = gdomain.smallend.vect[2];
    iVar45 = gdomain.smallend.vect[1];
    iVar24 = (int)((IVar49.vect._0_8_ << 0x1f) >> 0x3f);
    local_2b4 = CONCAT44(iVar40,(uint)local_2b4);
    local_2ac = iVar24 + iVar23 + 1;
    local_2a8 = iVar30;
    local_2a4[0] = iVar34;
    local_2a4[1] = iVar24 + iVar23 + iVar43 + 1;
    local_2a4[2] = iVar29;
    local_2a4[3] = bx_2.btype.itype & 0xfffffffd;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      local_2a4[lVar26] =
           (local_2a4[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_2a4[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_2a4[3] = ~uVar39 & local_2a4[3];
      }
      else {
        local_2a4[3] = uVar39 | local_2a4[3];
      }
    }
    IVar49 = Box::type(&gdomain);
    uVar18 = IVar49.vect[0] & 1;
    iVar29 = (iVar44 - uVar18) + 1;
    iVar44 = iVar21 + (iVar44 - uVar18) + 1;
    tmp.btype.itype = gdomain.btype.itype & 0xfffffffe;
    tmp.smallend.vect[1] = iVar45;
    tmp.smallend.vect[2] = iVar33;
    tmp.bigend.vect[1] = iVar41;
    tmp.bigend.vect[2] = iVar25;
    tmp.smallend.vect[0] = iVar29;
    tmp.bigend.vect[0] = iVar44;
    IVar49 = Box::type(&tmp);
    iVar23 = gdomain.bigend.vect[1];
    iVar30 = gdomain.bigend.vect[0];
    iVar45 = gdomain.smallend.vect[1];
    iVar24 = (int)((IVar49.vect._0_8_ << 0x1f) >> 0x3f);
    aiStack_288[3] = tmp.btype.itype & 0xfffffffd;
    iStack_294 = iVar29;
    iStack_290 = iVar24 + iVar41 + 1;
    iStack_28c = iVar33;
    aiStack_288[0] = iVar44;
    aiStack_288[2] = iVar25;
    aiStack_288[1] = iVar24 + iVar41 + iVar43 + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      aiStack_288[lVar26] =
           (aiStack_288[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_288[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        aiStack_288[3] = ~uVar39 & aiStack_288[3];
      }
      else {
        aiStack_288[3] = uVar39 | aiStack_288[3];
      }
    }
    local_26c = gdomain.smallend.vect[0] + -1;
    register0x00000014 = gdomain.bigend.vect[1];
    iVar33 = gdomain.smallend.vect[2] - iVar28;
    iVar24 = gdomain.smallend.vect[2] + -1;
    local_260 = gdomain.btype.itype & 0xfffffffa;
    local_278 = (pointer)CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0] - local_4c0);
    local_270 = iVar33;
    local_264 = iVar24;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&local_26c)[lVar26] =
           ((&local_26c)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_260 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_260 = ~uVar39 & local_260;
      }
      else {
        local_260 = uVar39 | local_260;
      }
    }
    IVar49 = Box::type(&gdomain);
    iVar29 = gdomain.bigend.vect[2];
    local_234[1] = gdomain.bigend.vect[1];
    iVar30 = iVar30 - (IVar49.vect[0] & 1);
    local_25c._4_4_ = iVar45;
    local_25c._0_4_ = iVar30 + 1;
    local_244 = gdomain.btype.itype & 0xfffffffa;
    local_254 = iVar33;
    local_250 = (Real)CONCAT44(iVar23,iVar21 + iVar30 + 1);
    local_248 = iVar24;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_250 + lVar26 * 4) =
           (*(int *)((long)&local_250 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_244 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_244 = ~uVar39 & local_244;
      }
      else {
        local_244 = uVar39 | local_244;
      }
    }
    local_100.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_100.smallend.vect[0] = gdomain.smallend.vect[0] - local_4c0;
    iVar33 = gdomain.smallend.vect[0] + -1;
    local_100.smallend.vect[1] = gdomain.smallend.vect[1];
    local_100.smallend.vect[2] = gdomain.smallend.vect[2];
    local_100.bigend.vect[1] = gdomain.bigend.vect[1];
    local_100.bigend.vect[2] = gdomain.bigend.vect[2];
    RVar10 = (Real)CONCAT44(gdomain.smallend.vect[1],local_100.smallend.vect[0]);
    local_100.bigend.vect[0] = iVar33;
    IVar49 = Box::type(&local_100);
    iVar45 = gdomain.bigend.vect[2];
    local_120.bigend.vect[1] = gdomain.bigend.vect[1];
    iVar24 = gdomain.bigend.vect[0];
    local_120.smallend.vect[2] = gdomain.smallend.vect[2];
    local_234[5] = gdomain.smallend.vect[1];
    iVar29 = iVar29 - (IVar49.vect[2] & 1);
    local_234[3] = local_100.btype.itype & 0xfffffffb;
    local_240 = RVar10;
    local_238 = iVar29 + 1;
    local_234[0] = iVar33;
    local_234[2] = iVar22 + iVar29 + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      local_234[lVar26] =
           (local_234[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_234[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_234[3] = ~uVar39 & local_234[3];
      }
      else {
        local_234[3] = uVar39 | local_234[3];
      }
    }
    IVar49 = Box::type(&gdomain);
    uVar18 = IVar49.vect[0] & 1;
    iVar23 = (iVar24 - uVar18) + 1;
    local_120.bigend.vect[0] = (iVar24 - uVar18) + iVar21 + 1;
    local_120.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_120.smallend.vect[1] = local_234[5];
    local_120.bigend.vect[2] = iVar45;
    RVar10 = (Real)CONCAT44(local_120.bigend.vect[1],local_120.bigend.vect[0]);
    local_120.smallend.vect[0] = iVar23;
    IVar49 = Box::type(&local_120);
    iVar30 = gdomain.bigend.vect[1];
    iVar33 = gdomain.bigend.vect[0];
    iVar24 = gdomain.smallend.vect[0];
    iVar45 = iVar45 - (IVar49.vect[2] & 1);
    local_20c = local_120.btype.itype & 0xfffffffb;
    local_234[4] = iVar23;
    local_21c = iVar45 + 1;
    local_218 = RVar10;
    local_210 = iVar22 + iVar45 + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_218 + lVar26 * 4) =
           (*(int *)((long)&local_218 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_20c >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_20c = ~uVar39 & local_20c;
      }
      else {
        local_20c = uVar39 | local_20c;
      }
    }
    uVar35 = IVar48.vect._0_8_ & 0xffffffff00000000;
    iVar45 = gdomain.smallend.vect[2] - iVar28;
    iVar23 = gdomain.smallend.vect[2] + -1;
    local_1f0._0_4_ = gdomain.btype.itype & 0xfffffff9;
    local_208 = (Real)(CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0]) - uVar35 &
                       0xffffffff00000000 | (ulong)(uint)gdomain.smallend.vect[0]);
    local_200 = iVar45;
    local_1fc = ((ulong)(uint)gdomain.smallend.vect[1] << 0x20) - 0x100000000 |
                (ulong)(uint)gdomain.bigend.vect[0];
    local_1f4 = iVar23;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_1fc + lVar26 * 4) =
           (*(int *)((long)&local_1fc + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_1f0 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1f0._0_4_ = ~uVar39 & (uint)local_1f0;
      }
      else {
        local_1f0._0_4_ = uVar39 | (uint)local_1f0;
      }
    }
    IVar48 = Box::type(&gdomain);
    iVar29 = gdomain.bigend.vect[2];
    iVar44 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    local_1e8 = iVar30 + iVar44 + 1;
    uVar36._4_4_ = local_1e8;
    uVar36._0_4_ = iVar24;
    local_1d4 = gdomain.btype.itype & 0xfffffff9;
    local_1f0._4_4_ = iVar24;
    local_1e4 = iVar45;
    local_1e0 = CONCAT44(iVar30 + iVar44 + iVar43 + 1,iVar33);
    local_1d8 = iVar23;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_1e0 + lVar26 * 4) =
           (*(int *)((long)&local_1e0 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_1d4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1d4 = ~uVar39 & local_1d4;
      }
      else {
        local_1d4 = uVar39 | local_1d4;
      }
    }
    local_140.btype.itype = gdomain.btype.itype & 0xfffffffd;
    local_140.smallend.vect[1] = gdomain.smallend.vect[1] - local_480;
    local_140.bigend.vect[1] = gdomain.smallend.vect[1] + -1;
    local_140.smallend.vect[0] = gdomain.smallend.vect[0];
    local_140.smallend.vect[2] = gdomain.smallend.vect[2];
    local_140.bigend.vect[0] = gdomain.bigend.vect[0];
    local_140.bigend.vect[2] = gdomain.bigend.vect[2];
    uVar7 = CONCAT44(local_140.smallend.vect[1],gdomain.smallend.vect[0]);
    uVar8 = CONCAT44(local_140.bigend.vect[1],gdomain.bigend.vect[0]);
    unique0x10002c24 = uVar36;
    IVar48 = Box::type(&local_140);
    iVar45 = gdomain.bigend.vect[2];
    iVar24 = gdomain.bigend.vect[1];
    local_160.bigend.vect[0] = gdomain.bigend.vect[0];
    local_160.smallend.vect[2] = gdomain.smallend.vect[2];
    local_160.smallend.vect[0] = gdomain.smallend.vect[0];
    uVar18 = IVar48.vect[2] & 1;
    local_1b8 = local_140.btype.itype & 0xfffffffb;
    local_1d0 = uVar7;
    local_1c8 = (iVar29 - uVar18) + 1;
    local_1c4 = uVar8;
    local_1bc = iVar22 + (iVar29 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_1c4 + lVar26 * 4) =
           (*(int *)((long)&local_1c4 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_1b8 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1b8 = ~uVar39 & local_1b8;
      }
      else {
        local_1b8 = uVar39 | local_1b8;
      }
    }
    IVar48 = Box::type(&gdomain);
    iVar33 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    local_160.smallend.vect[1] = iVar33 + iVar24 + 1;
    local_160.bigend.vect[1] = iVar24 + iVar33 + iVar43 + 1;
    local_160.btype.itype = gdomain.btype.itype & 0xfffffffd;
    local_160.bigend.vect[2] = iVar45;
    uVar7 = CONCAT44(local_160.smallend.vect[1],local_160.smallend.vect[0]);
    uVar36 = CONCAT44(local_160.bigend.vect[1],local_160.bigend.vect[0]);
    IVar48 = Box::type(&local_160);
    uVar18 = IVar48.vect[2] & 1;
    local_19c = local_160.btype.itype & 0xfffffffb;
    local_1b4 = uVar7;
    local_1ac = (iVar45 - uVar18) + 1;
    local_1a8 = uVar36;
    local_1a0 = iVar22 + (iVar45 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_1a8 + lVar26 * 4) =
           (*(int *)((long)&local_1a8 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_19c >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_19c = ~uVar39 & local_19c;
      }
      else {
        local_19c = uVar39 | local_19c;
      }
    }
    for (lVar26 = 0; iVar24 = gdomain.bigend.vect[0], lVar26 != 0x150; lVar26 = lVar26 + 0x1c) {
      uVar7 = *(undefined8 *)((long)bx_8.smallend.vect + lVar26);
      uVar36 = *(undefined8 *)((long)bx_8.smallend.vect + lVar26 + 8);
      uVar8 = *(undefined8 *)((long)bx_8.bigend.vect + lVar26 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_8.bigend.vect + lVar26) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar8;
      tmp.btype.itype = (uint)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar7;
      tmp.smallend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar36;
      tmp.bigend.vect[0] = (int)((ulong)uVar36 >> 0x20);
      Box::operator&=(&tmp,local_350);
      bx_2.bigend.vect[1] = (int)local_358;
      bx_2.bigend.vect[2] = (int)((ulong)local_358 >> 0x20);
      bx_2.btype.itype = (uint)uVar32;
      local_440.x = iVar13;
      local_440.y = iVar14;
      local_440.z = iVar5;
      local_434 = (uint)uVar46;
      iStack_430 = (int)lVar31;
      iStack_42c = iVar20;
      local_428 = iVar4;
      local_424[1] = dcomp;
      local_424[2] = numcomp;
      aiStack_408[0] = bx_1.bigend.vect[1];
      aiStack_408[1] = bx_1.bigend.vect[2];
      IStack_400.itype = bx_1.btype.itype;
      local_424[3] = bx_1.smallend.vect[0];
      iStack_414 = bx_1.smallend.vect[1];
      iStack_410 = bx_1.smallend.vect[2];
      iStack_40c = bx_1.bigend.vect[0];
      local_3f8 = local_360;
      pGVar37 = &geomdata;
      pRVar38 = (Real *)&local_3e8;
      for (lVar27 = 0xf; lVar27 != 0; lVar27 = lVar27 + -1) {
        *pRVar38 = (pGVar37->prob_domain).xlo[0];
        pGVar37 = (GeometryData *)((long)pGVar37 + (ulong)bVar47 * -0x10 + 8);
        pRVar38 = pRVar38 + (ulong)bVar47 * -2 + 1;
      }
      local_368 = orig_comp;
      bx_2.smallend.vect[2] = iVar15;
      bx_2.bigend.vect[0] = iVar16;
      local_370 = time;
      For<amrex::GpuBndryFuncFab<PeleLMdummyFill>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_2_>
                (&tmp,(anon_class_264_10_7336990c *)&bx_2);
    }
    bx_2.smallend.vect[1] =
         (int)(CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0]) - uVar35 >> 0x20);
    uVar46 = ((ulong)(uint)gdomain.smallend.vect[1] << 0x20) - 0x100000000;
    iVar45 = gdomain.smallend.vect[2] + -1;
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffff8;
    bx_2.smallend.vect[0] = gdomain.smallend.vect[0] - local_4c0;
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2] - iVar28;
    bx_2.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_2.bigend.vect[1] = (int)(uVar46 >> 0x20);
    bx_2.bigend.vect[2] = iVar45;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      bx_2.bigend.vect[lVar26] =
           (bx_2.bigend.vect[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((bx_2.btype.itype >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        bx_2.btype.itype = ~uVar39 & bx_2.btype.itype;
      }
      else {
        bx_2.btype.itype = uVar39 | bx_2.btype.itype;
      }
    }
    IVar48 = Box::type(&gdomain);
    iVar30 = gdomain.bigend.vect[1];
    iVar33 = gdomain.smallend.vect[2];
    uVar46 = uVar46 | iVar21 + (iVar24 - (IVar48.vect[0] & 1)) + 1;
    local_434 = gdomain.btype.itype & 0xfffffff8;
    local_440.x = (int)uVar46;
    local_440.y = (int)(uVar46 >> 0x20);
    local_440.z = iVar45;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&local_440.x)[lVar26] =
           ((&local_440.x)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_434 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_434 = ~uVar39 & local_434;
      }
      else {
        local_434 = uVar39 | local_434;
      }
    }
    iVar34 = gdomain.smallend.vect[0] - local_4c0;
    iVar25 = gdomain.smallend.vect[0] + -1;
    bx_8.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_8.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_8.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_8.bigend.vect[2] = gdomain.bigend.vect[2];
    stack0xfffffffffffffd30 = CONCAT44(iStack_2cc,gdomain.btype.itype) & 0xfffffffffffffffe;
    bx_8.smallend.vect[0] = iVar34;
    bx_8.bigend.vect[0] = iVar25;
    IVar48 = Box::type(&bx_8);
    iVar44 = gdomain.bigend.vect[2];
    iVar29 = gdomain.bigend.vect[1];
    iVar23 = gdomain.bigend.vect[0];
    iVar45 = gdomain.smallend.vect[2];
    iVar24 = gdomain.smallend.vect[1];
    iVar41 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    local_424[3] = bx_8.btype.itype & 0xfffffff9;
    iStack_430 = iVar34;
    iStack_42c = iVar41 + iVar30 + 1;
    local_428 = iVar33 - iVar28;
    local_424[0] = iVar25;
    local_424[1] = iVar30 + iVar41 + iVar43 + 1;
    local_424[2] = iVar33 + -1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      local_424[lVar26] =
           (local_424[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_424[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_424[3] = ~uVar39 & local_424[3];
      }
      else {
        local_424[3] = uVar39 | local_424[3];
      }
    }
    IVar48 = Box::type(&gdomain);
    uVar18 = IVar48.vect[0] & 1;
    iVar41 = (iVar23 - uVar18) + 1;
    iVar33 = iVar21 + (iVar23 - uVar18) + 1;
    tmp.btype.itype = gdomain.btype.itype & 0xfffffffe;
    tmp.smallend.vect[1] = iVar24;
    tmp.smallend.vect[2] = iVar45;
    tmp.bigend.vect[1] = iVar29;
    tmp.bigend.vect[2] = iVar44;
    tmp.smallend.vect[0] = iVar41;
    tmp.bigend.vect[0] = iVar33;
    IVar48 = Box::type(&tmp);
    iVar24 = gdomain.bigend.vect[2];
    iVar30 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    local_3fc = tmp.btype.itype & 0xfffffff9;
    iStack_414 = iVar41;
    iStack_410 = iVar30 + iVar29 + 1;
    iStack_40c = iVar45 - iVar28;
    aiStack_408[0] = iVar33;
    aiStack_408[1] = iVar29 + iVar30 + iVar43 + 1;
    IStack_400.itype = iVar45 - 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      aiStack_408[lVar26] =
           (aiStack_408[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3fc >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3fc = ~uVar39 & local_3fc;
      }
      else {
        local_3fc = uVar39 | local_3fc;
      }
    }
    local_100.smallend.vect[0] = gdomain.smallend.vect[0] - local_4c0;
    iVar23 = gdomain.smallend.vect[0] + -1;
    local_100.smallend.vect[1] = gdomain.smallend.vect[1] - local_480;
    iVar29 = gdomain.smallend.vect[1] + -1;
    local_100.btype.itype = gdomain.btype.itype & 0xfffffffc;
    local_100.smallend.vect[2] = gdomain.smallend.vect[2];
    local_100.bigend.vect[2] = gdomain.bigend.vect[2];
    pBVar12 = (BCRec *)CONCAT44(local_100.smallend.vect[1],local_100.smallend.vect[0]);
    local_100.bigend.vect[0] = iVar23;
    local_100.bigend.vect[1] = iVar29;
    IVar48 = Box::type(&local_100);
    iVar30 = gdomain.bigend.vect[2];
    iVar33 = gdomain.bigend.vect[0];
    iVar45 = gdomain.smallend.vect[2];
    iVar28 = gdomain.smallend.vect[1];
    uVar18 = IVar48.vect[2] & 1;
    local_3e0 = local_100.btype.itype & 0xfffffffb;
    local_3f8 = pBVar12;
    local_3f0 = (iVar24 - uVar18) + 1;
    iStack_3ec = iVar23;
    local_3e8._0_4_ = iVar29;
    local_3e8._4_4_ = iVar22 + (iVar24 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      (&iStack_3ec)[lVar26] =
           ((&iStack_3ec)[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3e0 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3e0 = ~uVar39 & local_3e0;
      }
      else {
        local_3e0 = uVar39 | local_3e0;
      }
    }
    IVar48 = Box::type(&gdomain);
    uVar18 = IVar48.vect[0] & 1;
    local_120.smallend.vect[0] = (iVar33 - uVar18) + 1;
    local_120.bigend.vect[0] = (iVar33 - uVar18) + iVar21 + 1;
    local_120.smallend.vect[1] = iVar28 - local_480;
    local_120.bigend.vect[1] = iVar28 + -1;
    local_120.btype.itype = gdomain.btype.itype & 0xfffffffc;
    local_120.smallend.vect[2] = iVar45;
    local_120.bigend.vect[2] = iVar30;
    uVar8._4_4_ = local_120.smallend.vect[1];
    uVar8._0_4_ = local_120.smallend.vect[0];
    RVar10 = (Real)CONCAT44(local_120.bigend.vect[1],local_120.bigend.vect[0]);
    IVar48 = Box::type(&local_120);
    iVar45 = gdomain.bigend.vect[2];
    iVar24 = gdomain.bigend.vect[1];
    iVar28 = gdomain.smallend.vect[2];
    uVar18 = IVar48.vect[2] & 1;
    local_3c4 = local_120.btype.itype & 0xfffffffb;
    local_3dc = (Real)uVar8;
    local_3d4 = (iVar30 - uVar18) + 1;
    local_3d0 = RVar10;
    local_3c8 = iVar22 + (iVar30 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_3d0 + lVar26 * 4) =
           (*(int *)((long)&local_3d0 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar39 & local_3c4;
      }
      else {
        local_3c4 = uVar39 | local_3c4;
      }
    }
    local_4c0 = gdomain.smallend.vect[0] - local_4c0;
    iVar23 = gdomain.smallend.vect[0] + -1;
    local_160.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_160.smallend.vect[1] = gdomain.smallend.vect[1];
    local_160.smallend.vect[2] = gdomain.smallend.vect[2];
    local_160.bigend.vect[1] = gdomain.bigend.vect[1];
    local_160.bigend.vect[2] = gdomain.bigend.vect[2];
    local_160.smallend.vect[0] = local_4c0;
    local_160.bigend.vect[0] = iVar23;
    IVar48 = Box::type(&local_160);
    iVar33 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    local_140.smallend.vect[1] = iVar33 + iVar24 + 1;
    iVar30 = iVar24 + iVar33 + iVar43 + 1;
    local_140.btype.itype = local_160.btype.itype & 0xfffffffd;
    local_140.smallend.vect[2] = iVar28;
    local_140.bigend.vect[2] = iVar45;
    RVar10 = (Real)CONCAT44(local_140.smallend.vect[1],local_4c0);
    local_140.smallend.vect[0] = local_4c0;
    local_140.bigend.vect[0] = iVar23;
    local_140.bigend.vect[1] = iVar30;
    IVar48 = Box::type(&local_140);
    iVar33 = gdomain.bigend.vect[2];
    iVar24 = gdomain.bigend.vect[1];
    iVar28 = gdomain.bigend.vect[0];
    local_e0.smallend.vect[2] = gdomain.smallend.vect[2];
    uVar18 = IVar48.vect[2] & 1;
    local_3b4[3] = local_140.btype.itype & 0xfffffffb;
    local_3c0 = RVar10;
    local_3b8 = (iVar45 - uVar18) + 1;
    local_3b4[0] = iVar23;
    local_3b4[1] = iVar30;
    local_3b4[2] = iVar22 + (iVar45 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      local_3b4[lVar26] =
           (local_3b4[lVar26] + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_3b4[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3b4[3] = ~uVar39 & local_3b4[3];
      }
      else {
        local_3b4[3] = uVar39 | local_3b4[3];
      }
    }
    uVar9._4_4_ = gdomain.smallend.vect[2];
    uVar9._0_4_ = gdomain.smallend.vect[1];
    uVar11._4_4_ = gdomain.bigend.vect[2];
    uVar11._0_4_ = gdomain.bigend.vect[1];
    IVar48 = Box::type(&gdomain);
    uVar18 = IVar48.vect[0] & 1;
    iVar45 = (iVar28 - uVar18) + 1;
    iVar21 = (iVar28 - uVar18) + iVar21 + 1;
    local_c4.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_c4.smallend.vect[0] = iVar45;
    local_c4.smallend.vect._4_8_ = uVar9;
    local_c4.bigend.vect[0] = iVar21;
    local_c4.bigend.vect._4_8_ = uVar11;
    IVar48 = Box::type(&local_c4);
    iVar28 = (int)((IVar48.vect._0_8_ << 0x1f) >> 0x3f);
    IVar19.itype = iVar28 + iVar24 + 1;
    local_e0.bigend.vect[1] = iVar24 + iVar28 + iVar43 + 1;
    local_e0.btype.itype = local_c4.btype.itype & 0xfffffffd;
    local_e0.bigend.vect[2] = iVar33;
    RVar10 = (Real)CONCAT44(local_e0.bigend.vect[1],iVar21);
    local_e0.smallend.vect[0] = iVar45;
    local_e0.smallend.vect[1] = IVar19.itype;
    local_e0.bigend.vect[0] = iVar21;
    IVar48 = Box::type(&local_e0);
    uVar18 = IVar48.vect[2] & 1;
    local_38c = local_e0.btype.itype & 0xfffffffb;
    local_3b4[4] = iVar45;
    local_3b4[5] = IVar19.itype;
    local_39c = (iVar33 - uVar18) + 1;
    local_398 = RVar10;
    local_390 = iVar22 + (iVar33 - uVar18) + 1;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      uVar39 = 1 << ((byte)lVar26 & 0x1f);
      uVar18 = (uint)lVar26;
      *(uint *)((long)&local_398 + lVar26 * 4) =
           (*(int *)((long)&local_398 + lVar26 * 4) + (uint)((uVar3 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_38c >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar18 & 0x1f) & 1) == 0) {
        local_38c = ~uVar39 & local_38c;
      }
      else {
        local_38c = uVar39 | local_38c;
      }
    }
    for (lVar26 = 0; lVar26 != 0xe0; lVar26 = lVar26 + 0x1c) {
      uVar7 = *(undefined8 *)((long)bx_2.smallend.vect + lVar26);
      uVar36 = *(undefined8 *)((long)bx_2.smallend.vect + lVar26 + 8);
      uVar8 = *(undefined8 *)((long)bx_2.bigend.vect + lVar26 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_2.bigend.vect + lVar26) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar8;
      tmp.btype.itype = (uint)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar7;
      tmp.smallend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar36;
      tmp.bigend.vect[0] = (int)((ulong)uVar36 >> 0x20);
      Box::operator&=(&tmp,local_350);
      bx_8.bigend.vect[1] = (int)local_358;
      bx_8.bigend.vect[2] = (int)((ulong)local_358 >> 0x20);
      stack0xfffffffffffffd30 = uVar32;
      local_2c0.x = iVar13;
      local_2c0.y = iVar14;
      local_2c0.z = iVar5;
      local_2b4 = uVar42;
      local_2ac = iVar20;
      local_2a8 = iVar4;
      local_2a4[1] = dcomp;
      local_2a4[2] = numcomp;
      aiStack_288[0] = bx_1.bigend.vect[1];
      aiStack_288[1] = bx_1.bigend.vect[2];
      aiStack_288[2] = bx_1.btype.itype;
      local_2a4[3] = bx_1.smallend.vect[0];
      iStack_294 = bx_1.smallend.vect[1];
      iStack_290 = bx_1.smallend.vect[2];
      iStack_28c = bx_1.bigend.vect[0];
      local_278 = local_360;
      pGVar37 = &geomdata;
      pRVar38 = (Real *)auStack_268;
      for (lVar31 = 0xf; lVar31 != 0; lVar31 = lVar31 + -1) {
        *pRVar38 = (pGVar37->prob_domain).xlo[0];
        pGVar37 = (GeometryData *)((long)pGVar37 + (ulong)bVar47 * -0x10 + 8);
        pRVar38 = pRVar38 + (ulong)bVar47 * -2 + 1;
      }
      local_1e8 = orig_comp;
      bx_8.smallend.vect[2] = iVar15;
      bx_8.bigend.vect[0] = iVar16;
      local_1f0 = time;
      For<amrex::GpuBndryFuncFab<PeleLMdummyFill>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_3_>
                (&tmp,(anon_class_264_10_7336990c *)&bx_8);
    }
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}